

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86.cpp
# Opt level: O3

int __thiscall
ncnn::HardSigmoid_x86::forward_inplace(HardSigmoid_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  long lVar6;
  undefined1 (*pauVar7) [16];
  int iVar8;
  uint uVar9;
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  
  auVar4 = _DAT_005a58a0;
  iVar3 = bottom_top_blob->c;
  if (0 < (long)iVar3) {
    uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar6 = 0;
    do {
      pauVar7 = (undefined1 (*) [16])
                (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar5 < 4) {
        uVar9 = 0;
      }
      else {
        iVar8 = 3;
        do {
          fVar2 = (this->super_HardSigmoid).beta;
          fVar11 = (this->super_HardSigmoid).alpha;
          auVar12._0_4_ = fVar11 * *(float *)*pauVar7 + fVar2;
          auVar12._4_4_ = fVar11 * *(float *)((long)*pauVar7 + 4) + fVar2;
          auVar12._8_4_ = fVar11 * *(float *)((long)*pauVar7 + 8) + fVar2;
          auVar12._12_4_ = fVar11 * *(float *)((long)*pauVar7 + 0xc) + fVar2;
          auVar12 = maxps(auVar12,ZEXT816(0));
          auVar12 = minps(auVar12,auVar4);
          *pauVar7 = auVar12;
          pauVar7 = pauVar7 + 1;
          iVar8 = iVar8 + 4;
          uVar9 = uVar5 & 0xfffffffc;
        } while (iVar8 < (int)uVar5);
      }
      if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
        lVar10 = 0;
        do {
          fVar2 = *(float *)((long)*pauVar7 + lVar10 * 4);
          fVar11 = 0.0;
          if (((this->super_HardSigmoid).lower <= fVar2) &&
             (pfVar1 = &(this->super_HardSigmoid).upper, fVar11 = 1.0,
             fVar2 < *pfVar1 || fVar2 == *pfVar1)) {
            fVar11 = fVar2 * (this->super_HardSigmoid).alpha + (this->super_HardSigmoid).beta;
          }
          *(float *)((long)*pauVar7 + lVar10 * 4) = fVar11;
          lVar10 = lVar10 + 1;
        } while (uVar5 - uVar9 != (int)lVar10);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar3);
  }
  return 0;
}

Assistant:

int HardSigmoid_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ptr++;
        }
    }

    return 0;
}